

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.hpp
# Opt level: O2

int32_t __thiscall
poincare_disc::
Dictionary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
getLine(Dictionary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,ifstream *ifs,vector<int,_std::allocator<int>_> *words)

{
  pointer piVar1;
  bool bVar2;
  size_t *psVar3;
  int iVar4;
  string token;
  int local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  piVar1 = (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar1;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  iVar4 = 0;
  while( true ) {
    bVar2 = readWord(this,ifs,&local_50);
    if (!bVar2) break;
    bVar2 = std::operator!=(&local_50,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            EOS_abi_cxx11_);
    if (!bVar2) break;
    psVar3 = get_hash(this,&local_50);
    if (psVar3 == (size_t *)0x0) {
      psVar3 = get_hash(this,(key_type *)UNK_abi_cxx11_);
      local_54 = (int)*psVar3;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(words,&local_54);
    }
    else {
      local_54 = (int)*psVar3;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(words,&local_54);
    }
    iVar4 = iVar4 + 1;
  }
  std::__cxx11::string::~string((string *)&local_50);
  return iVar4;
}

Assistant:

const int32_t getLine(std::ifstream& ifs, std::vector<int32_t>& words) {
        std::uniform_real_distribution<> uniform(0, 1);

        words.clear();
        int32_t ntokens = 0;
        std::string token;
        while (this->readWord(ifs, token) && token != EOS) {
            size_t* wid = get_hash(token);
            ntokens++;
            if(wid) {
                words.push_back(*wid);       
            } else {
                wid = get_hash(UNK);
                words.push_back(*wid);       
            }
        }
        return ntokens;
    }